

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void __thiscall
cppnet::SingletonLogger::SetLogger(SingletonLogger *this,shared_ptr<cppnet::Logger> *log)

{
  element_type *peVar1;
  __shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  peVar1 = (this->_logger).super___shared_ptr<cppnet::BaseLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&log->super___shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar1->_logger).super___shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void SingletonLogger::SetLogger(std::shared_ptr<Logger> log) {
    _logger->SetLogger(log);
}